

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sensor.h
# Opt level: O0

void __thiscall Sensor::~Sensor(Sensor *this)

{
  Sensor *this_local;
  
  this->_vptr_Sensor = (_func_int **)&PTR__Sensor_002d4c48;
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&this->R_);
  std::__cxx11::string::~string((string *)&this->name_);
  return;
}

Assistant:

virtual ~Sensor() {}